

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNDescr.cpp
# Opt level: O1

void __thiscall NaNeuralNetDescr::NaNeuralNetDescr(NaNeuralNetDescr *this,NaNeuralNetDescr *rDescr)

{
  NaActFuncKind NVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  (this->super_NaLogging)._vptr_NaLogging = (_func_int **)&PTR_PrintLog_00174678;
  NaConfigPart::NaConfigPart(&this->super_NaConfigPart,&rDescr->super_NaConfigPart);
  (this->super_NaLogging)._vptr_NaLogging = (_func_int **)&PTR_PrintLog_001747b0;
  (this->super_NaConfigPart)._vptr_NaConfigPart = (_func_int **)&PTR__NaNeuralNetDescr_001747e8;
  NaVector::NaVector(&this->vInputDelays,0);
  NaVector::NaVector(&this->vOutputDelays,0);
  uVar3 = rDescr->nHidLayers;
  this->nHidLayers = uVar3;
  uVar4 = 0;
  do {
    uVar5 = 0;
    if (uVar4 < uVar3) {
      uVar5 = rDescr->nHidNeurons[uVar4];
    }
    this->nHidNeurons[uVar4] = uVar5;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 10);
  NVar1 = rDescr->eLastActFunc;
  this->nOutNeurons = rDescr->nOutNeurons;
  this->eLastActFunc = NVar1;
  uVar3 = rDescr->nInputsRepeat;
  uVar5 = rDescr->nOutputsRepeat;
  uVar2 = rDescr->nFeedbackDepth;
  this->nInputsNumber = rDescr->nInputsNumber;
  this->nInputsRepeat = uVar3;
  this->nOutputsRepeat = uVar5;
  this->nFeedbackDepth = uVar2;
  MakeDefaultDelays(this);
  uVar3 = NaVector::dim(&rDescr->vInputDelays);
  if (uVar3 == this->nInputsRepeat) {
    NaVector::operator=(&this->vInputDelays,&rDescr->vInputDelays);
  }
  uVar3 = NaVector::dim(&rDescr->vOutputDelays);
  if (uVar3 == this->nOutputsRepeat) {
    NaVector::operator=(&this->vOutputDelays,&rDescr->vOutputDelays);
  }
  return;
}

Assistant:

NaNeuralNetDescr::NaNeuralNetDescr (const NaNeuralNetDescr& rDescr)
:   NaConfigPart(rDescr)
{
    nHidLayers = rDescr.nHidLayers;

    unsigned    i;
    for(i = 0; i < NaMAX_HIDDEN; ++i)
        if(i < nHidLayers)
            nHidNeurons[i] = rDescr.nHidNeurons[i];
        else
            nHidNeurons[i] = 0;

    nOutNeurons = rDescr.nOutNeurons;
    nInputsNumber = rDescr.nInputsNumber;
    nInputsRepeat = rDescr.nInputsRepeat;
    nOutputsRepeat = rDescr.nOutputsRepeat;
    nFeedbackDepth = rDescr.nFeedbackDepth;
    eLastActFunc = rDescr.eLastActFunc;

    MakeDefaultDelays();

    if(rDescr.vInputDelays.dim() == nInputsRepeat)
      vInputDelays = rDescr.vInputDelays;
    if(rDescr.vOutputDelays.dim() == nOutputsRepeat)
      vOutputDelays = rDescr.vOutputDelays;
}